

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O3

AsyncRequest * __thiscall
ot::commissioner::CommissionerSafe::PopAsyncRequest
          (AsyncRequest *__return_storage_ptr__,CommissionerSafe *this)

{
  mutex *__mutex;
  function<void_()> *__x;
  int iVar1;
  undefined8 uVar2;
  
  __mutex = &this->mInvokeMutex;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    __x = (this->mAsyncRequestQueue).c.
          super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
          _M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((this->mAsyncRequestQueue).c.
        super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur == __x) {
      (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
      __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
      *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
      *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
    }
    else {
      std::function<void_()>::function(__return_storage_ptr__,__x);
      std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::pop_front
                (&(this->mAsyncRequestQueue).c);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return __return_storage_ptr__;
  }
  uVar2 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar2);
}

Assistant:

CommissionerSafe::AsyncRequest CommissionerSafe::PopAsyncRequest()
{
    std::lock_guard<std::mutex> _(mInvokeMutex);

    if (!mAsyncRequestQueue.empty())
    {
        auto ret = mAsyncRequestQueue.front();
        mAsyncRequestQueue.pop();
        return ret;
    }
    return nullptr;
}